

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barray.c
# Opt level: O0

void bit_array_mask(void *dest,void *source,size_t offset)

{
  int iVar1;
  ulong in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  bool bVar2;
  size_t soffset;
  size_t *ssize;
  size_t *dsize;
  ulong local_30;
  ulong local_18;
  
  if ((in_RDI != (ulong *)0x0) && (in_RSI != (ulong *)0x0)) {
    local_30 = 0;
    local_18 = in_RDX;
    while( true ) {
      bVar2 = false;
      if (local_18 < *in_RDI) {
        bVar2 = local_30 < *in_RSI;
      }
      if (!bVar2) break;
      iVar1 = bit_array_test(in_RSI,local_30);
      if (iVar1 != 0) {
        bit_array_clear(in_RDI,local_18);
      }
      local_30 = local_30 + 1;
      local_18 = local_18 + 1;
    }
  }
  return;
}

Assistant:

void bit_array_mask(void * dest, void * source, size_t offset)
{
	if (dest && source)
	{
		size_t * dsize = (size_t *) dest;
		size_t * ssize = (size_t *) source;
		size_t soffset = 0;
		while (offset < *dsize && soffset < *ssize)
		{
			if (bit_array_test(source, soffset))
			{
				bit_array_clear(dest, offset);
			}
			soffset++;
			offset++;
		}
	}
}